

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

int vm_new_fn(VM *vm,int pkg_idx)

{
  BcIns **ppBVar1;
  int iVar2;
  Function *pFVar3;
  
  iVar2 = vm->fns_capacity;
  if (iVar2 <= vm->fns_count) {
    vm->fns_capacity = iVar2 * 2;
    pFVar3 = (Function *)realloc(vm->fns,(long)iVar2 * 0x30);
    vm->fns = pFVar3;
  }
  pFVar3 = vm->fns;
  iVar2 = vm->fns_count;
  vm->fns_count = iVar2 + 1;
  pFVar3[iVar2].pkg = pkg_idx;
  ppBVar1 = &pFVar3[iVar2].ins;
  *ppBVar1 = (BcIns *)0x0;
  ppBVar1[1] = (BcIns *)0x0;
  return iVar2;
}

Assistant:

int vm_new_fn(VM *vm, int pkg_idx) {
	if (vm->fns_count >= vm->fns_capacity) {
		vm->fns_capacity *= 2;
		vm->fns = realloc(vm->fns, sizeof(Function) * vm->fns_capacity);
	}

	Function *fn = &vm->fns[vm->fns_count++];
	fn->pkg = pkg_idx;
	fn->ins = NULL; // Lazily instatiate the bytecode array
	fn->ins_count = 0;
	fn->ins_capacity = 0;
	return vm->fns_count - 1;
}